

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void cm_expat_XML_DefaultCurrent(XML_Parser parser)

{
  undefined8 *puVar1;
  
  if (*(long *)((long)parser + 0xa0) == 0) {
    return;
  }
  puVar1 = *(undefined8 **)((long)parser + 0x230);
  if (puVar1 != (undefined8 *)0x0) {
    reportDefault(parser,*(ENCODING **)((long)parser + 0x1b8),(char *)*puVar1,(char *)puVar1[1]);
    return;
  }
  reportDefault(parser,*(ENCODING **)((long)parser + 0x118),*(char **)((long)parser + 0x218),
                *(char **)((long)parser + 0x220));
  return;
}

Assistant:

void XML_DefaultCurrent(XML_Parser parser)
{
  if (defaultHandler) {
    if (openInternalEntities)
      reportDefault(parser,
                    internalEncoding,
                    openInternalEntities->internalEventPtr,
                    openInternalEntities->internalEventEndPtr);
    else
      reportDefault(parser, encoding, eventPtr, eventEndPtr);
  }
}